

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::SourceRange>::
emplace_back<slang::SourceLocation&,slang::SourceLocation&>
          (SmallVectorBase<slang::SourceRange> *this,SourceLocation *args,SourceLocation *args_1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  SourceLocation SVar3;
  size_type sVar4;
  ulong uVar5;
  pointer p;
  undefined8 uVar6;
  pointer pSVar7;
  pointer pSVar8;
  pointer pSVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  pointer __src;
  long lVar13;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    SVar3 = *args_1;
    __src->startLoc = *args;
    __src->endLoc = SVar3;
    sVar4 = this->len;
    this->len = sVar4 + 1;
    return this->data_ + sVar4;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar12 = this->len + 1;
  uVar5 = this->cap;
  if (uVar12 < uVar5 * 2) {
    uVar12 = uVar5 * 2;
  }
  if (0x7ffffffffffffff - uVar5 < uVar5) {
    uVar12 = 0x7ffffffffffffff;
  }
  lVar13 = (long)__src - (long)this->data_;
  pSVar9 = (pointer)operator_new(uVar12 << 4);
  SVar3 = *args_1;
  *(SourceLocation *)((long)pSVar9 + lVar13) = *args;
  *(SourceLocation *)((long)pSVar9 + lVar13 + 8) = SVar3;
  p = this->data_;
  lVar10 = this->len * 0x10;
  lVar11 = (long)p + (lVar10 - (long)__src);
  pSVar7 = p;
  pSVar8 = pSVar9;
  if (lVar11 == 0) {
    if (this->len != 0) {
      lVar11 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(p->startLoc).field_0x0 + lVar11);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pSVar9->startLoc).field_0x0 + lVar11);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        lVar11 = lVar11 + 0x10;
      } while (lVar10 != lVar11);
    }
  }
  else {
    for (; pSVar7 != __src; pSVar7 = pSVar7 + 1) {
      SVar3 = pSVar7->endLoc;
      pSVar8->startLoc = pSVar7->startLoc;
      pSVar8->endLoc = SVar3;
      pSVar8 = pSVar8 + 1;
    }
    memcpy((void *)((long)pSVar9 + lVar13 + 0x10),__src,(lVar11 - 0x10U & 0xfffffffffffffff0) + 0x10
          );
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar12;
  this->data_ = pSVar9;
  return (reference)((long)pSVar9 + lVar13);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }